

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordlist-demo.c
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  wordlist_t wordlist;
  wordlist_t wStack_38;
  
  wordlist_init(&wStack_38);
  if (1 < argc) {
    uVar1 = 1;
    do {
      wordlist_add(&wStack_38,argv[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)argc != uVar1);
  }
  wordlist_print(&wStack_38);
  wordlist_delete(&wStack_38);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{

    struct wordlist_t wordlist;
    wordlist_init(&wordlist);

    /* add each argument (after 0) to queue; just keep pointer */
    for (int i=1; i < argc; i++)
    {
        wordlist_add(&wordlist, argv[i]);
    }

    wordlist_print(&wordlist);
    wordlist_delete(&wordlist);
}